

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void welcomeScreen(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"              ___     ___");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |   |   |   |");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |___|   |___|");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," __            |       |            __");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  |___        |       |        ___|  |");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|__|   |     __|_______|__     |   |__|");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"       |____|             |____|");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," __         |             |         __");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  |________|   GDS-cpp   |________|  |");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|__|        |             |        |__|");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"        ____|             |____");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," __    |    |_____________|    |    __");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|  |___|       |       |       |___|  |");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|__|           |       |           |__|");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"              _|_     _|_");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |   |   |   |");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"             |___|   |___|");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void welcomeScreen()
{
  cout << "              ___     ___" << endl;
  cout << "             |   |   |   |" << endl;
  cout << "             |___|   |___|" << endl;
  cout << " __            |       |            __" << endl;
  cout << "|  |___        |       |        ___|  |" << endl;
  cout << "|__|   |     __|_______|__     |   |__|" << endl;
  cout << "       |____|             |____|" << endl;
  cout << " __         |             |         __" << endl;
  cout << "|  |________|   GDS-cpp   |________|  |" << endl;
  cout << "|__|        |             |        |__|" << endl;
  cout << "        ____|             |____" << endl;
  cout << " __    |    |_____________|    |    __" << endl;
  cout << "|  |___|       |       |       |___|  |" << endl;
  cout << "|__|           |       |           |__|" << endl;
  cout << "              _|_     _|_" << endl;
  cout << "             |   |   |   |" << endl;
  cout << "             |___|   |___|" << endl;
}